

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplicationstatic.h
# Opt level: O0

void QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::reset(void)

{
  PlainType *this;
  long in_FS_OFFSET;
  QMutexLocker<QBasicMutex> locker;
  undefined7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  QMutexLocker<QBasicMutex> *this_00;
  QMutexLocker<QBasicMutex> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.m_mutex = (QBasicMutex *)0xaaaaaaaaaaaaaaaa;
  local_18.m_isLocked = true;
  local_18._9_7_ = 0xaaaaaaaaaaaaaa;
  this_00 = &local_18;
  QMutexLocker<QBasicMutex>::QMutexLocker
            (this_00,(QBasicMutex *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  this = realPointer();
  QFactoryLoader::~QFactoryLoader((QFactoryLoader *)this);
  QBasicAtomicInteger<signed_char>::storeRelaxed
            ((QBasicAtomicInteger<signed_char> *)this_00,in_stack_ffffffffffffffdf);
  QMutexLocker<QBasicMutex>::~QMutexLocker(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void reset()
    {
        // we only synchronize using the mutex here, not the guard
        QMutexLocker locker(&mutex);
        realPointer()->~PlainType();
        guard.storeRelaxed(QtGlobalStatic::Uninitialized);
    }